

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O2

void prvTidyNormalizeSpaces(Lexer *lexer,Node *node)

{
  byte bVar1;
  tmbstr ptVar2;
  Bool BVar3;
  uint uVar4;
  ulong in_RAX;
  uint c_00;
  tmbstr buf;
  uint uVar5;
  ulong uVar6;
  undefined4 uStack_38;
  uint c;
  
  _uStack_38 = in_RAX;
  for (; node != (Node *)0x0; node = node->next) {
    if (node->content != (Node *)0x0) {
      prvTidyNormalizeSpaces(lexer,node->content);
    }
    BVar3 = prvTidynodeIsText(node);
    if (BVar3 != no) {
      uVar6 = (ulong)node->start;
      buf = lexer->lexbuf + uVar6;
      while( true ) {
        ptVar2 = lexer->lexbuf;
        uVar5 = (uint)uVar6;
        if (node->end <= uVar5) break;
        bVar1 = ptVar2[uVar6];
        _uStack_38 = (ulong)CONCAT14(bVar1,uStack_38);
        c_00 = (uint)bVar1;
        if ((char)bVar1 < '\0') {
          uVar4 = prvTidyGetUTF8(ptVar2 + uVar6,&c);
          uVar5 = uVar5 + uVar4;
          c_00 = c;
        }
        if (c_00 == 0xa0) {
          _uStack_38 = CONCAT44(0x20,uStack_38);
          c_00 = 0x20;
        }
        buf = prvTidyPutUTF8(buf,c_00);
        uVar6 = (ulong)(uVar5 + 1);
      }
      node->end = (int)buf - (int)ptVar2;
    }
  }
  return;
}

Assistant:

void TY_(NormalizeSpaces)(Lexer *lexer, Node *node)
{
    while ( node )
    {
        if ( node->content )
            TY_(NormalizeSpaces)( lexer, node->content );

        if (TY_(nodeIsText)(node))
        {
            uint i, c;
            tmbstr p = lexer->lexbuf + node->start;

            for (i = node->start; i < node->end; ++i)
            {
                c = (byte) lexer->lexbuf[i];

                /* look for UTF-8 multibyte character */
                if ( c > 0x7F )
                    i += TY_(GetUTF8)( lexer->lexbuf + i, &c );

                if ( c == 160 )
                    c = ' ';

                p = TY_(PutUTF8)(p, c);
            }
            node->end = p - lexer->lexbuf;
        }

        node = node->next;
    }
}